

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebm_util.cc
# Opt level: O1

bool libwebm::ParseVP9SuperFrameIndex
               (uint8_t *frame,size_t frame_length,Ranges *frame_ranges,bool *error)

{
  pointer *ppRVar1;
  iterator __position;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  byte *pbVar8;
  uint uVar9;
  byte *pbVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  Range local_40;
  
  if ((error == (bool *)0x0 || frame_ranges == (Ranges *)0x0) ||
      (frame_length == 0 || frame == (uint8_t *)0x0)) {
    return false;
  }
  bVar2 = frame[frame_length - 1];
  if ((bVar2 & 0xe0) != 0xc0) {
    return false;
  }
  uVar9 = bVar2 & 7;
  uVar7 = (ulong)(((bVar2 >> 3 & 3) + 1) * (uVar9 + 1) + 2);
  uVar12 = frame_length - uVar7;
  if (frame_length < uVar7) {
    ParseVP9SuperFrameIndex();
LAB_0010beeb:
    bVar5 = 0;
  }
  else {
    if ((uVar7 <= uVar12) && (frame[uVar12] == bVar2)) {
      pbVar10 = frame + uVar12 + 1;
      uVar3 = bVar2 >> 3 & 3;
      bVar15 = false;
      sVar11 = 0;
      uVar14 = 0;
      do {
        iVar6 = 0;
        uVar4 = 0;
        pbVar8 = pbVar10;
        do {
          bVar2 = *pbVar8;
          pbVar8 = pbVar8 + 1;
          uVar4 = uVar4 | (uint)bVar2 << ((byte)iVar6 & 0x1f);
          iVar6 = iVar6 + 8;
        } while (uVar3 * 8 + 8 != iVar6);
        uVar13 = uVar12 - sVar11;
        uVar7 = (ulong)uVar4;
        if (uVar13 < uVar7) {
          ParseVP9SuperFrameIndex((libwebm *)error);
        }
        else {
          __position._M_current =
               (frame_ranges->super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          local_40.offset = sVar11;
          local_40.length = uVar7;
          if (__position._M_current ==
              (frame_ranges->super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::
            _M_realloc_insert<libwebm::Range>(frame_ranges,__position,&local_40);
          }
          else {
            (__position._M_current)->offset = sVar11;
            (__position._M_current)->length = uVar7;
            ppRVar1 = &(frame_ranges->
                       super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppRVar1 = *ppRVar1 + 1;
          }
          sVar11 = sVar11 + uVar7;
        }
        if (uVar13 < uVar7) {
          if (!bVar15) {
            bVar2 = 0;
            bVar5 = 0;
            goto LAB_0010bef2;
          }
          break;
        }
        pbVar10 = pbVar10 + (ulong)uVar3 + 1;
        bVar15 = uVar9 <= uVar14;
        bVar16 = uVar14 != uVar9;
        uVar14 = uVar14 + 1;
      } while (bVar16);
      bVar2 = 1;
      bVar5 = 1;
      if (uVar9 + 1 ==
          (int)((ulong)((long)(frame_ranges->
                              super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(frame_ranges->
                             super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 4)) goto LAB_0010bef2;
      ParseVP9SuperFrameIndex();
      goto LAB_0010beeb;
    }
    ParseVP9SuperFrameIndex();
    bVar5 = 1;
  }
  *error = true;
  bVar2 = 0;
LAB_0010bef2:
  return (bool)(bVar2 & bVar5);
}

Assistant:

bool ParseVP9SuperFrameIndex(const std::uint8_t* frame,
                             std::size_t frame_length, Ranges* frame_ranges,
                             bool* error) {
  if (frame == nullptr || frame_length == 0 || frame_ranges == nullptr ||
      error == nullptr) {
    return false;
  }

  bool parse_ok = false;
  const std::uint8_t marker = frame[frame_length - 1];
  const std::uint32_t kHasSuperFrameIndexMask = 0xe0;
  const std::uint32_t kSuperFrameMarker = 0xc0;
  const std::uint32_t kLengthFieldSizeMask = 0x3;

  if ((marker & kHasSuperFrameIndexMask) == kSuperFrameMarker) {
    const std::uint32_t kFrameCountMask = 0x7;
    const int num_frames = (marker & kFrameCountMask) + 1;
    const int length_field_size = ((marker >> 3) & kLengthFieldSizeMask) + 1;
    const std::size_t index_length = 2 + length_field_size * num_frames;

    if (frame_length < index_length) {
      std::fprintf(stderr,
                   "VP9ParseSuperFrameIndex: Invalid superframe index size.\n");
      *error = true;
      return false;
    }

    // Consume the super frame index. Note: it's at the end of the super frame.
    const std::size_t length = frame_length - index_length;

    if (length >= index_length &&
        frame[frame_length - index_length] == marker) {
      // Found a valid superframe index.
      const std::uint8_t* byte = frame + length + 1;

      std::size_t frame_offset = 0;

      for (int i = 0; i < num_frames; ++i) {
        std::uint32_t child_frame_length = 0;

        for (int j = 0; j < length_field_size; ++j) {
          child_frame_length |= (*byte++) << (j * 8);
        }

        if (length - frame_offset < child_frame_length) {
          std::fprintf(stderr,
                       "ParseVP9SuperFrameIndex: Invalid superframe, sub frame "
                       "larger than entire frame.\n");
          *error = true;
          return false;
        }

        frame_ranges->push_back(Range(frame_offset, child_frame_length));
        frame_offset += child_frame_length;
      }

      if (static_cast<int>(frame_ranges->size()) != num_frames) {
        std::fprintf(stderr, "VP9Parse: superframe index parse failed.\n");
        *error = true;
        return false;
      }

      parse_ok = true;
    } else {
      std::fprintf(stderr, "VP9Parse: Invalid superframe index.\n");
      *error = true;
    }
  }
  return parse_ok;
}